

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_select_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::BaseSelectBinder::BindExpression
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  BaseExpression *this_00;
  idx_t group_index;
  WindowExpression *pWVar2;
  BinderException local_60;
  string local_50;
  
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr_ptr)->super_BaseExpression;
  group_index = TryBindGroup(this,(ParsedExpression *)this_00);
  if (group_index == 0xffffffffffffffff) {
    EVar1 = this_00->expression_class;
    if (EVar1 == WINDOW) {
      pWVar2 = BaseExpression::Cast<duckdb::WindowExpression>(this_00);
      (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[0x10])
                (__return_storage_ptr__,this,pWVar2,depth);
    }
    else if (EVar1 == DEFAULT) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"SELECT clause cannot contain DEFAULT clause","");
      BinderException::Unsupported(&local_60,(ParsedExpression *)this_00,&local_50);
      BindResult::BindResult(__return_storage_ptr__,&local_60.super_Exception);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    else if (EVar1 == COLUMN_REF) {
      (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[0x11])
                (__return_storage_ptr__,this,expr_ptr,depth,(ulong)root_expression);
    }
    else {
      ExpressionBinder::BindExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,root_expression
                );
    }
  }
  else {
    BindGroup(__return_storage_ptr__,this,(ParsedExpression *)this_00,depth,group_index);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult BaseSelectBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	// check if the expression binds to one of the groups
	auto group_index = TryBindGroup(expr);
	if (group_index != DConstants::INVALID_INDEX) {
		return BindGroup(expr, depth, group_index);
	}
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::COLUMN_REF:
		return BindColumnRef(expr_ptr, depth, root_expression);
	case ExpressionClass::DEFAULT:
		return BindResult(BinderException::Unsupported(expr, "SELECT clause cannot contain DEFAULT clause"));
	case ExpressionClass::WINDOW:
		return BindWindow(expr.Cast<WindowExpression>(), depth);
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth, root_expression);
	}
}